

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_setup_connection(Curl_easy *data,connectdata *conn)

{
  char cVar1;
  FTP *pFVar2;
  char *pcVar3;
  char *local_58;
  char command;
  ftp_conn *ftpc;
  CURLcode result;
  FTP *ftp;
  char *type;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  pFVar2 = (FTP *)(*Curl_ccalloc)(1,0x20);
  if (pFVar2 == (FTP *)0x0) {
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    if ((data->set).str[0x22] != (char *)0x0) {
      pcVar3 = (*Curl_cstrdup)((data->set).str[0x22]);
      (conn->proto).ftpc.account = pcVar3;
      if ((conn->proto).ftpc.account == (char *)0x0) {
        (*Curl_cfree)(pFVar2);
        return CURLE_OUT_OF_MEMORY;
      }
    }
    if ((data->set).str[0x23] != (char *)0x0) {
      pcVar3 = (*Curl_cstrdup)((data->set).str[0x23]);
      (conn->proto).ftpc.alternative_to_user = pcVar3;
      if ((conn->proto).ftpc.alternative_to_user == (char *)0x0) {
        (*Curl_cfree)((conn->proto).ftpc.account);
        (conn->proto).ftpc.account = (char *)0x0;
        (*Curl_cfree)(pFVar2);
        return CURLE_OUT_OF_MEMORY;
      }
    }
    (data->req).p.ftp = pFVar2;
    pFVar2->path = (data->state).up.path + 1;
    ftp = (FTP *)strstr(pFVar2->path,";type=");
    if (ftp == (FTP *)0x0) {
      ftp = (FTP *)strstr((conn->host).rawalloc,";type=");
    }
    if (ftp != (FTP *)0x0) {
      *(undefined1 *)&ftp->path = 0;
      cVar1 = Curl_raw_toupper(*(char *)((long)&ftp->path + 6));
      if (cVar1 == 'A') {
        *(uint *)&(data->state).field_0x7be =
             *(uint *)&(data->state).field_0x7be & 0xffffbfff | 0x4000;
      }
      else if (cVar1 == 'D') {
        *(uint *)&(data->state).field_0x7be =
             *(uint *)&(data->state).field_0x7be & 0xffff7fff | 0x8000;
      }
      else {
        *(uint *)&(data->state).field_0x7be = *(uint *)&(data->state).field_0x7be & 0xffffbfff;
      }
    }
    pFVar2->transfer = PPTRANSFER_BODY;
    pFVar2->downloadsize = 0;
    (conn->proto).ftpc.known_filesize = -1;
    (conn->proto).ftpc.use_ssl = (data->set).use_ssl;
    (conn->proto).ftpc.ccc = (data->set).ftp_ccc;
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
        (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
       (0 < Curl_trc_feat_ftp.log_level)) {
      if (conn == (connectdata *)0x0) {
        local_58 = "???";
      }
      else {
        local_58 = ftp_state_names[(conn->proto).ftpc.state];
      }
      Curl_trc_ftp(data,"[%s] setup connection -> %d",local_58,0);
    }
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode ftp_setup_connection(struct Curl_easy *data,
                                     struct connectdata *conn)
{
  char *type;
  struct FTP *ftp;
  CURLcode result = CURLE_OK;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  ftp = calloc(1, sizeof(struct FTP));
  if(!ftp)
    return CURLE_OUT_OF_MEMORY;

  /* clone connection related data that is FTP specific */
  if(data->set.str[STRING_FTP_ACCOUNT]) {
    ftpc->account = strdup(data->set.str[STRING_FTP_ACCOUNT]);
    if(!ftpc->account) {
      free(ftp);
      return CURLE_OUT_OF_MEMORY;
    }
  }
  if(data->set.str[STRING_FTP_ALTERNATIVE_TO_USER]) {
    ftpc->alternative_to_user =
      strdup(data->set.str[STRING_FTP_ALTERNATIVE_TO_USER]);
    if(!ftpc->alternative_to_user) {
      Curl_safefree(ftpc->account);
      free(ftp);
      return CURLE_OUT_OF_MEMORY;
    }
  }
  data->req.p.ftp = ftp;

  ftp->path = &data->state.up.path[1]; /* do not include the initial slash */

  /* FTP URLs support an extension like ";type=<typecode>" that
   * we will try to get now! */
  type = strstr(ftp->path, ";type=");

  if(!type)
    type = strstr(conn->host.rawalloc, ";type=");

  if(type) {
    char command;
    *type = 0;                     /* it was in the middle of the hostname */
    command = Curl_raw_toupper(type[6]);

    switch(command) {
    case 'A': /* ASCII mode */
      data->state.prefer_ascii = TRUE;
      break;

    case 'D': /* directory mode */
      data->state.list_only = TRUE;
      break;

    case 'I': /* binary mode */
    default:
      /* switch off ASCII */
      data->state.prefer_ascii = FALSE;
      break;
    }
  }

  /* get some initial data into the ftp struct */
  ftp->transfer = PPTRANSFER_BODY;
  ftp->downloadsize = 0;
  ftpc->known_filesize = -1; /* unknown size for now */
  ftpc->use_ssl = data->set.use_ssl;
  ftpc->ccc = data->set.ftp_ccc;

  CURL_TRC_FTP(data, "[%s] setup connection -> %d", FTP_CSTATE(conn), result);
  return result;
}